

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

QName * __thiscall
Assimp::CFIReaderImpl::parseQualifiedNameOrIndex3
          (CFIReaderImpl *this,
          vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
          *qNameTable)

{
  string *psVar1;
  size_t __n;
  size_type sVar2;
  DeadlyImportError *this_00;
  size_t index;
  string local_a8 [32];
  undefined1 local_88 [8];
  QName result;
  uint8_t b;
  vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
  *qNameTable_local;
  CFIReaderImpl *this_local;
  
  result.name.field_2._M_local_buf[0xf] = *this->dataP;
  if ((result.name.field_2._M_local_buf[0xf] & 0x3cU) == 0x3c) {
    this->dataP = this->dataP + 1;
    QName::QName((QName *)local_88);
    if ((result.name.field_2._M_local_buf[0xf] & 2U) == 0) {
      std::__cxx11::string::string(local_a8);
    }
    else {
      psVar1 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).prefixTable);
      std::__cxx11::string::string(local_a8,(string *)psVar1);
    }
    std::__cxx11::string::operator=((string *)local_88,local_a8);
    std::__cxx11::string::~string(local_a8);
    if ((result.name.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::__cxx11::string::string((string *)&index);
    }
    else {
      psVar1 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).namespaceNameTable);
      std::__cxx11::string::string((string *)&index,(string *)psVar1);
    }
    std::__cxx11::string::operator=
              ((string *)(result.prefix.field_2._M_local_buf + 8),(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    psVar1 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).localNameTable);
    std::__cxx11::string::operator=
              ((string *)(result.uri.field_2._M_local_buf + 8),(string *)psVar1);
    std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::
    push_back(qNameTable,(value_type *)local_88);
    this_local = (CFIReaderImpl *)
                 std::
                 vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                 ::back(qNameTable);
    QName::~QName((QName *)local_88);
  }
  else {
    __n = parseInt3(this);
    sVar2 = std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
            ::size(qNameTable);
    if (sVar2 <= __n) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_local = (CFIReaderImpl *)
                 std::
                 vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                 ::operator[](qNameTable,__n);
  }
  return (QName *)this_local;
}

Assistant:

const QName &parseQualifiedNameOrIndex3(std::vector<QName> &qNameTable) { // C.18
        uint8_t b = *dataP;
        if ((b & 0x3c) == 0x3c) { // xx1111..
            // We have a literal (C.18.3)
            ++dataP;
            QName result;
            // prefix (C.18.3.1)
            result.prefix = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
            // namespace-name (C.18.3.1)
            result.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
            // local-name
            result.name = parseIdentifyingStringOrIndex(vocabulary.localNameTable);
            qNameTable.push_back(result);
            return qNameTable.back();
        }
        else {
            // We have an index (C.18.4)
            size_t index = parseInt3();
            if (index >= qNameTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return qNameTable[index];
        }
    }